

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

Message * __thiscall
google::protobuf::anon_unknown_19::GeneratedMessageFactory::TryGetPrototype
          (GeneratedMessageFactory *this,Descriptor *type)

{
  flat_hash_set<const_google::protobuf::internal::DescriptorTable_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
  *this_00;
  ctrl_t *pcVar1;
  DescriptorPool *pDVar2;
  string *psVar3;
  pointer pcVar4;
  DescriptorTable *pDVar5;
  ctrl_t *pcVar6;
  long lVar7;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
  *this_01;
  DescriptorByNameEq *pDVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  undefined1 uVar11;
  undefined1 *puVar12;
  ctrl_t cVar13;
  ctrl_t cVar14;
  ctrl_t cVar15;
  ctrl_t cVar16;
  ctrl_t cVar17;
  ctrl_t cVar18;
  ctrl_t cVar19;
  ctrl_t cVar20;
  ctrl_t cVar21;
  ctrl_t cVar22;
  ctrl_t cVar23;
  ctrl_t cVar24;
  ctrl_t cVar25;
  ctrl_t cVar26;
  ctrl_t cVar27;
  ctrl_t cVar28;
  ctrl_t cVar29;
  ctrl_t cVar30;
  ctrl_t cVar31;
  ctrl_t cVar32;
  ctrl_t cVar33;
  ctrl_t cVar34;
  ctrl_t cVar35;
  ctrl_t cVar36;
  ctrl_t cVar37;
  ctrl_t cVar38;
  ctrl_t cVar39;
  ctrl_t cVar40;
  ctrl_t cVar41;
  ctrl_t cVar42;
  ctrl_t cVar43;
  ctrl_t cVar44;
  bool bVar45;
  ushort uVar46;
  DescriptorPool *pDVar47;
  uint64_t uVar48;
  size_t sVar49;
  slot_type *ppDVar50;
  anon_union_8_1_a8a14541_for_iterator_2 aVar51;
  _Storage<const_google::protobuf::Message_*,_true> _Var52;
  flat_hash_set<const_google::protobuf::internal::DescriptorTable_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
  *pfVar53;
  pointer pcVar54;
  HeapOrSoo *pHVar55;
  uint64_t v_1;
  uint uVar56;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
  *prVar57;
  DescriptorTable *unaff_R12;
  size_t cap_2;
  Mutex *this_02;
  ulong uVar58;
  uchar *bytes_1;
  ulong uVar59;
  undefined1 (*pauVar60) [16];
  uint64_t v_3;
  ulong uVar61;
  undefined4 uVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  __m128i match;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  string_view str;
  string_view v_00;
  optional<const_google::protobuf::Message_*> oVar67;
  iterator iVar68;
  string_view rhs;
  string_view rhs_00;
  string_view rhs_01;
  string_view rhs_02;
  string_view rhs_03;
  uchar *bytes;
  uint64_t v;
  LogMessage local_68;
  undefined1 local_58 [16];
  ctrl_t local_48;
  ctrl_t cStack_47;
  ctrl_t cStack_46;
  ctrl_t cStack_45;
  ctrl_t cStack_44;
  ctrl_t cStack_43;
  ctrl_t cStack_42;
  ctrl_t cStack_41;
  ctrl_t cStack_40;
  ctrl_t cStack_3f;
  ctrl_t cStack_3e;
  ctrl_t cStack_3d;
  ctrl_t cStack_3c;
  ctrl_t cStack_3b;
  ctrl_t cStack_3a;
  ctrl_t cStack_39;
  
  this_02 = &this->mutex_;
  absl::lts_20250127::Mutex::ReaderLock(this_02);
  oVar67 = FindInTypeMap(this,type);
  absl::lts_20250127::Mutex::ReaderUnlock(this_02);
  if ((oVar67.super__Optional_base<const_google::protobuf::Message_*,_true,_true>._M_payload.
       super__Optional_payload_base<const_google::protobuf::Message_*>._M_engaged &
      oVar67.super__Optional_base<const_google::protobuf::Message_*,_true,_true>._M_payload.
      super__Optional_payload_base<const_google::protobuf::Message_*>._M_payload._M_value !=
      (Message *)0x0) != 0) {
    return (Message *)
           oVar67.super__Optional_base<const_google::protobuf::Message_*,_true,_true>._M_payload.
           super__Optional_payload_base<const_google::protobuf::Message_*>._M_payload;
  }
  pDVar2 = type->file_->pool_;
  pDVar47 = DescriptorPool::generated_pool();
  if (pDVar2 != pDVar47) {
    return (Message *)0x0;
  }
  psVar3 = type->file_->name_;
  pcVar4 = (psVar3->_M_dataplus)._M_p;
  pDVar5 = (DescriptorTable *)psVar3->_M_string_length;
  this_00 = &this->files_;
  pcVar54 = pcVar4;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
              *)(this->files_).
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                .settings_.
                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                value.capacity_);
  if (1 < (this->files_).
          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
          .settings_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          size_) {
    uVar48 = absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                       (&absl::lts_20250127::hash_internal::MixingHashState::kSeed,pcVar4,pDVar5);
    uVar59 = uVar48 ^ (ulong)pDVar5;
    prVar57 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
               *)(this_00->
                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                 ).settings_.
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.capacity_;
    unaff_R12 = pDVar5;
    if (prVar57 ==
        (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
         *)0x1) {
      ppDVar50 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                 ::soo_slot(&this_00->
                             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                           );
      pDVar8 = (DescriptorByNameEq *)(*ppDVar50)->filename;
      rhs_02._M_str = pcVar54;
      rhs_02._M_len = (size_t)pcVar4;
      bVar45 = DescriptorByNameEq::operator()(pDVar8,pDVar5,rhs_02);
      if (bVar45) {
        sVar49 = strlen((char *)pDVar8);
        uVar48 = absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                           (&absl::lts_20250127::hash_internal::MixingHashState::kSeed,pDVar8,sVar49
                           );
        if (uVar59 != (uVar48 ^ sVar49)) {
LAB_0023db95:
          __assert_fail("(!is_key_equal || is_hash_equal) && \"eq(k1, k2) must imply that hash(k1) == hash(k2). \" \"hash/eq functors are inconsistent.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xfbf,
                        "auto absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, std::allocator<const google::protobuf::internal::DescriptorTable *>>::AssertHashEqConsistent(const std::basic_string_view<char> &)::(anonymous class)::operator()(const ctrl_t *, slot_type *) const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, Hash = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, Eq = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, Alloc = std::allocator<const google::protobuf::internal::DescriptorTable *>]"
                       );
        }
      }
    }
    else {
      if (prVar57 ==
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
           *)0x0) goto LAB_0023ddfd;
      if (prVar57 < (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                     *)0x11) {
        unaff_R12 = *(DescriptorTable **)
                     ((long)&(this->files_).
                             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                             .settings_.
                             super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                             .
                             super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                             .value.heap_or_soo_ + 8);
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
        ::slot_array(prVar57);
        uVar61 = (this->files_).
                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                 .settings_.
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.capacity_;
        pauVar60 = (undefined1 (*) [16])
                   (this->files_).
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                   .settings_.
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.heap_or_soo_.heap.control;
        if (uVar61 < 0xf) {
          if (8 < uVar61) {
            __assert_fail("(cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\") && \"Try enabling sanitizers.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x78b,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::internal::DescriptorTable *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                         );
          }
          pcVar54 = (pointer)0x8080808080808080;
          uVar61 = *(ulong *)(*pauVar60 + uVar61) & 0x8080808080808080;
          if (uVar61 != 0x8080808080808080) {
            uVar61 = uVar61 ^ 0x8080808080808080;
            do {
              lVar7 = 0;
              if (uVar61 != 0) {
                for (; (uVar61 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
                }
              }
              pDVar8 = *(DescriptorByNameEq **)
                        (*(long *)((long)unaff_R12 + ((ulong)((uint)lVar7 & 0xfffffff8) - 8)) + 0x10
                        );
              rhs_00._M_str = pcVar54;
              rhs_00._M_len = (size_t)pcVar4;
              bVar45 = DescriptorByNameEq::operator()(pDVar8,pDVar5,rhs_00);
              if (bVar45) {
                sVar49 = strlen((char *)pDVar8);
                uVar48 = absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                                   (&absl::lts_20250127::hash_internal::MixingHashState::kSeed,
                                    pDVar8,sVar49);
                if (uVar59 != (uVar48 ^ sVar49)) goto LAB_0023db95;
              }
              uVar61 = uVar61 & uVar61 - 1;
            } while (uVar61 != 0);
          }
        }
        else {
          uVar61 = (this->files_).
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                   .settings_.
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.size_;
          if (1 < uVar61) {
            local_58._0_8_ = this_02;
            uVar61 = uVar61 >> 1;
            uVar58 = uVar61;
            while( true ) {
              auVar63 = *pauVar60;
              uVar56 = (uint)(ushort)((ushort)(SUB161(auVar63 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar63 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar63 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar63 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar63 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar63 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar63 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar63 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar63 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar63 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar63 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar63 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar63 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar63 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar63 >> 0x77,0) & 1) << 0xe |
                                     (ushort)(byte)(auVar63[0xf] >> 7) << 0xf);
              if (uVar56 != 0xffff) {
                uVar56 = ~uVar56;
                do {
                  uVar9 = 0;
                  if (uVar56 != 0) {
                    for (; (uVar56 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
                    }
                  }
                  if ((char)(*pauVar60)[uVar9] < '\0') {
                    __assert_fail("(IsFull(ctrl[i]) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                                  ,0x79d,
                                  "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::internal::DescriptorTable *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                                 );
                  }
                  pDVar8 = *(DescriptorByNameEq **)
                            (*(long *)(&unaff_R12->is_initialized + (ulong)uVar9 * 8) + 0x10);
                  rhs_03._M_str = pcVar54;
                  rhs_03._M_len = (size_t)pcVar4;
                  bVar45 = DescriptorByNameEq::operator()(pDVar8,pDVar5,rhs_03);
                  if (bVar45) {
                    sVar49 = strlen((char *)pDVar8);
                    uVar48 = absl::lts_20250127::hash_internal::MixingHashState::
                             CombineContiguousImpl
                                       (&absl::lts_20250127::hash_internal::MixingHashState::kSeed,
                                        pDVar8,sVar49);
                    if (uVar59 != (uVar48 ^ sVar49)) goto LAB_0023db95;
                  }
                  uVar58 = uVar58 - 1;
                  uVar46 = (ushort)(uVar56 - 1) & (ushort)uVar56;
                  uVar56 = CONCAT22((short)(uVar56 - 1 >> 0x10),uVar46);
                } while (uVar46 != 0);
              }
              if (uVar58 == 0) break;
              unaff_R12 = (DescriptorTable *)&unaff_R12[1].num_deps;
              puVar12 = *pauVar60;
              pauVar60 = pauVar60 + 1;
              if (puVar12[0xf] == -1) {
                __assert_fail("((remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0x7a5,
                              "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::internal::DescriptorTable *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                             );
              }
            }
            this_02 = (Mutex *)local_58._0_8_;
            if (uVar61 < (this->files_).
                         super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                         .settings_.
                         super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                         .
                         super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                         .value.size_ >> 1) {
              __assert_fail("(original_size_for_assert >= c.size() && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7aa,
                            "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::internal::DescriptorTable *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                           );
            }
          }
        }
      }
    }
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
              *)(this_00->
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                ).settings_.
                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                value.capacity_);
  prVar57 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
             *)(this_00->
               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
               ).settings_.
               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
               .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
               value.capacity_;
  if (prVar57 !=
      (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
       *)0x1) {
    if (prVar57 !=
        (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
         *)0x0) {
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
      ::prefetch_heap_block(prVar57);
      uVar48 = absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                         (&absl::lts_20250127::hash_internal::MixingHashState::kSeed,pcVar4,pDVar5);
      prVar57 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                 *)(this->files_).
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                   .settings_.
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.capacity_;
      if (prVar57 ==
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
           *)0x1) {
        __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xe2a,
                      "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, std::allocator<const google::protobuf::internal::DescriptorTable *>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, Hash = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, Eq = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, Alloc = std::allocator<const google::protobuf::internal::DescriptorTable *>, K = std::basic_string_view<char>]"
                     );
      }
      if (prVar57 !=
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
           *)0x0) {
        pfVar53 = (flat_hash_set<const_google::protobuf::internal::DescriptorTable_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                   *)((long)&(prVar57->settings_).
                             super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                             .
                             super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                             .value.capacity_ + 1);
        if (((ulong)pfVar53 & (ulong)prVar57) != 0) {
          __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x14c,
                        "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]"
                       );
        }
        uVar59 = (uVar48 ^ (ulong)pDVar5) * -0x234dd359734ecb13;
        pcVar6 = (this->files_).
                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                 .settings_.
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.heap_or_soo_.heap.control;
        uVar61 = (uVar59 >> 0x38 | (uVar59 & 0xff000000000000) >> 0x28 |
                  (uVar59 & 0xff0000000000) >> 0x18 | (uVar59 & 0xff00000000) >> 8 |
                  (uVar59 & 0xff000000) << 8 | (uVar59 & 0xff0000) << 0x18 |
                  (uVar59 & 0xff00) << 0x28 | uVar59 << 0x38) >> 7 ^ (ulong)pcVar6 >> 0xc;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
        ::control(prVar57);
        uVar11 = (undefined1)(uVar59 >> 0x38);
        auVar63 = ZEXT216(CONCAT11(uVar11,uVar11) & 0x7f7f);
        auVar63 = pshuflw(auVar63,auVar63,0);
        uVar62 = auVar63._0_4_;
        auVar65._4_4_ = uVar62;
        auVar65._0_4_ = uVar62;
        auVar65._8_4_ = uVar62;
        auVar65._12_4_ = uVar62;
        pHVar55 = (HeapOrSoo *)0x0;
        while( true ) {
          uVar61 = uVar61 & (ulong)prVar57;
          pcVar1 = pcVar6 + uVar61;
          auVar64[0] = -(auVar65[0] == *pcVar1);
          auVar64[1] = -(auVar65[1] == pcVar1[1]);
          auVar64[2] = -(auVar65[2] == pcVar1[2]);
          auVar64[3] = -(auVar65[3] == pcVar1[3]);
          auVar64[4] = -(auVar65[4] == pcVar1[4]);
          auVar64[5] = -(auVar65[5] == pcVar1[5]);
          auVar64[6] = -(auVar65[6] == pcVar1[6]);
          auVar64[7] = -(auVar65[7] == pcVar1[7]);
          auVar64[8] = -(auVar65[8] == pcVar1[8]);
          auVar64[9] = -(auVar65[9] == pcVar1[9]);
          auVar64[10] = -(auVar65[10] == pcVar1[10]);
          auVar64[0xb] = -(auVar65[0xb] == pcVar1[0xb]);
          auVar64[0xc] = -(auVar65[0xc] == pcVar1[0xc]);
          auVar64[0xd] = -(auVar65[0xd] == pcVar1[0xd]);
          auVar64[0xe] = -(auVar65[0xe] == pcVar1[0xe]);
          auVar64[0xf] = -(auVar65[0xf] == pcVar1[0xf]);
          uVar46 = (ushort)(SUB161(auVar64 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar64 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar64 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar64 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar64 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar64 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar64 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar64 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar64 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar64 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar64 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar64 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar64 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar64 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar64 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar64[0xf] >> 7) << 0xf;
          uVar56 = (uint)uVar46;
          cVar29 = *pcVar1;
          cVar30 = pcVar1[1];
          cVar31 = pcVar1[2];
          cVar32 = pcVar1[3];
          cVar33 = pcVar1[4];
          cVar34 = pcVar1[5];
          cVar35 = pcVar1[6];
          cVar36 = pcVar1[7];
          cVar37 = pcVar1[8];
          cVar38 = pcVar1[9];
          cVar39 = pcVar1[10];
          cVar40 = pcVar1[0xb];
          cVar41 = pcVar1[0xc];
          cVar42 = pcVar1[0xd];
          cVar43 = pcVar1[0xe];
          cVar44 = pcVar1[0xf];
          cVar13 = local_48;
          cVar14 = cStack_47;
          cVar15 = cStack_46;
          cVar16 = cStack_45;
          cVar17 = cStack_44;
          cVar18 = cStack_43;
          cVar19 = cStack_42;
          cVar20 = cStack_41;
          cVar21 = cStack_40;
          cVar22 = cStack_3f;
          cVar23 = cStack_3e;
          cVar24 = cStack_3d;
          cVar25 = cStack_3c;
          cVar26 = cStack_3b;
          cVar27 = cStack_3a;
          cVar28 = cStack_39;
          while (cStack_39 = cVar44, cStack_3a = cVar43, cStack_3b = cVar42, cStack_3c = cVar41,
                cStack_3d = cVar40, cStack_3e = cVar39, cStack_3f = cVar38, cStack_40 = cVar37,
                cStack_41 = cVar36, cStack_42 = cVar35, cStack_43 = cVar34, cStack_44 = cVar33,
                cStack_45 = cVar32, cStack_46 = cVar31, cStack_47 = cVar30, local_48 = cVar29,
                uVar46 != 0) {
            uVar9 = 0;
            if (uVar56 != 0) {
              for (; (uVar56 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
              }
            }
            lVar7 = *(long *)((long)&(this->files_).
                                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                                     .settings_.
                                     super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                     .
                                     super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                     .value.heap_or_soo_ + 8);
            local_58 = auVar65;
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
            ::slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                          *)(this->files_).
                            super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                            .settings_.
                            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                            .
                            super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                            .value.capacity_);
            uVar59 = uVar9 + uVar61 & (ulong)prVar57;
            rhs._M_str = (char *)pfVar53;
            rhs._M_len = (size_t)pcVar4;
            bVar45 = DescriptorByNameEq::operator()
                               (*(DescriptorByNameEq **)(*(long *)(lVar7 + uVar59 * 8) + 0x10),
                                pDVar5,rhs);
            if (bVar45) {
              iVar68 = absl::lts_20250127::container_internal::
                       raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                       ::iterator_at(&this_00->
                                      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                                     ,uVar59);
              goto LAB_0023dbce;
            }
            uVar46 = (ushort)(uVar56 - 1) & (ushort)uVar56;
            uVar56 = CONCAT22((short)(uVar56 - 1 >> 0x10),uVar46);
            auVar65 = local_58;
            cVar29 = local_48;
            cVar30 = cStack_47;
            cVar31 = cStack_46;
            cVar32 = cStack_45;
            cVar33 = cStack_44;
            cVar34 = cStack_43;
            cVar35 = cStack_42;
            cVar36 = cStack_41;
            cVar37 = cStack_40;
            cVar38 = cStack_3f;
            cVar39 = cStack_3e;
            cVar40 = cStack_3d;
            cVar41 = cStack_3c;
            cVar42 = cStack_3b;
            cVar43 = cStack_3a;
            cVar44 = cStack_39;
            cVar13 = local_48;
            cVar14 = cStack_47;
            cVar15 = cStack_46;
            cVar16 = cStack_45;
            cVar17 = cStack_44;
            cVar18 = cStack_43;
            cVar19 = cStack_42;
            cVar20 = cStack_41;
            cVar21 = cStack_40;
            cVar22 = cStack_3f;
            cVar23 = cStack_3e;
            cVar24 = cStack_3d;
            cVar25 = cStack_3c;
            cVar26 = cStack_3b;
            cVar27 = cStack_3a;
            cVar28 = cStack_39;
          }
          auVar66[0] = -(local_48 == kEmpty);
          auVar66[1] = -(cStack_47 == kEmpty);
          auVar66[2] = -(cStack_46 == kEmpty);
          auVar66[3] = -(cStack_45 == kEmpty);
          auVar66[4] = -(cStack_44 == kEmpty);
          auVar66[5] = -(cStack_43 == kEmpty);
          auVar66[6] = -(cStack_42 == kEmpty);
          auVar66[7] = -(cStack_41 == kEmpty);
          auVar66[8] = -(cStack_40 == kEmpty);
          auVar66[9] = -(cStack_3f == kEmpty);
          auVar66[10] = -(cStack_3e == kEmpty);
          auVar66[0xb] = -(cStack_3d == kEmpty);
          auVar66[0xc] = -(cStack_3c == kEmpty);
          auVar66[0xd] = -(cStack_3b == kEmpty);
          auVar66[0xe] = -(cStack_3a == kEmpty);
          auVar66[0xf] = -(cStack_39 == kEmpty);
          this_01 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                     *)(this_00->
                       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                       ).settings_.
                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                       .
                       super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                       .value.capacity_;
          local_48 = cVar13;
          cStack_47 = cVar14;
          cStack_46 = cVar15;
          cStack_45 = cVar16;
          cStack_44 = cVar17;
          cStack_43 = cVar18;
          cStack_42 = cVar19;
          cStack_41 = cVar20;
          cStack_40 = cVar21;
          cStack_3f = cVar22;
          cStack_3e = cVar23;
          cStack_3d = cVar24;
          cStack_3c = cVar25;
          cStack_3b = cVar26;
          cStack_3a = cVar27;
          if ((((((((((((((((auVar66 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar66 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar66 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar66 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar66 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar66 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar66 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar66 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar66 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar66 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar66 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar66 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar66 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar66 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar66 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              cStack_39 == kEmpty) break;
          cStack_39 = cVar28;
          if (this_01 ==
              (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
               *)0x0) goto LAB_0023ddfd;
          uVar61 = (long)pHVar55 + uVar61 + 0x10;
          pHVar55 = pHVar55 + 1;
          pfVar53 = this_00;
          if (this_01 < pHVar55) {
            __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0xe37,
                          "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, std::allocator<const google::protobuf::internal::DescriptorTable *>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, Hash = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, Eq = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, Alloc = std::allocator<const google::protobuf::internal::DescriptorTable *>, K = std::basic_string_view<char>]"
                         );
          }
        }
        cStack_39 = cVar28;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
        ::AssertNotDebugCapacity(this_01);
        auVar10._8_8_ = 0;
        auVar10._0_8_ = prVar57;
        iVar68 = (iterator)(auVar10 << 0x40);
        goto LAB_0023dbce;
      }
    }
LAB_0023ddfd:
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, std::allocator<const google::protobuf::internal::DescriptorTable *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, Hash = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, Eq = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, Alloc = std::allocator<const google::protobuf::internal::DescriptorTable *>]"
                 );
  }
  prVar57 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
             *)0x1;
  if (1 < (this->files_).
          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
          .settings_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          size_) {
    ppDVar50 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
               ::soo_slot(&this_00->
                           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                         );
    rhs_01._M_str = pcVar54;
    rhs_01._M_len = (size_t)pcVar4;
    bVar45 = DescriptorByNameEq::operator()
                       ((DescriptorByNameEq *)(*ppDVar50)->filename,pDVar5,rhs_01);
    if (bVar45) {
      aVar51.slot_ = absl::lts_20250127::container_internal::
                     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                     ::soo_slot(&this_00->
                                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                               );
      iVar68.field_1.slot_ = aVar51.slot_;
      iVar68.ctrl_ = absl::lts_20250127::container_internal::kSooControl;
      goto LAB_0023dbce;
    }
    prVar57 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
               *)(this_00->
                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                 ).settings_.
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.capacity_;
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
  ::AssertNotDebugCapacity(prVar57);
  auVar63._8_8_ = 0;
  auVar63._0_8_ = unaff_R12;
  iVar68 = (iterator)(auVar63 << 0x40);
LAB_0023dbce:
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
              *)(this_00->
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                ).settings_.
                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                value.capacity_);
  bVar45 = absl::lts_20250127::container_internal::operator==
                     ((iterator *)iVar68.ctrl_,(iterator *)iVar68.field_1.slot_);
  if (!bVar45) {
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
    ::iterator::operator*((iterator *)iVar68.ctrl_);
    pDVar5 = *iVar68.field_1.slot_;
    if (pDVar5 != (DescriptorTable *)0x0) {
      absl::lts_20250127::Mutex::Lock(this_02);
      oVar67 = FindInTypeMap(this,type);
      _Var52 = oVar67.super__Optional_base<const_google::protobuf::Message_*,_true,_true>._M_payload
               .super__Optional_payload_base<const_google::protobuf::Message_*>._M_payload;
      if (((undefined1  [16])
           oVar67.super__Optional_base<const_google::protobuf::Message_*,_true,_true>._M_payload.
           super__Optional_payload_base<const_google::protobuf::Message_*> & (undefined1  [16])0x1)
          == (undefined1  [16])0x0) {
        internal::RegisterFileLevelMetadata(pDVar5);
        oVar67 = FindInTypeMap(this,type);
        _Var52 = oVar67.super__Optional_base<const_google::protobuf::Message_*,_true,_true>.
                 _M_payload.super__Optional_payload_base<const_google::protobuf::Message_*>.
                 _M_payload;
        if (((undefined1  [16])
             oVar67.super__Optional_base<const_google::protobuf::Message_*,_true,_true>._M_payload.
             super__Optional_payload_base<const_google::protobuf::Message_*> & (undefined1  [16])0x1
            ) == (undefined1  [16])0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_68,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.cc"
                     ,0x1aa,"result.has_value()");
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_68);
        }
      }
      absl::lts_20250127::Mutex::Unlock(this_02);
      return (Message *)_Var52;
    }
  }
  absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
            ((LogMessageDebugFatal *)&local_68,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.cc"
             ,0x19a);
  str._M_str = "File appears to be in generated pool but wasn\'t registered: ";
  str._M_len = 0x3c;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&local_68,str);
  psVar3 = type->file_->name_;
  v_00._M_str = (psVar3->_M_dataplus)._M_p;
  v_00._M_len = psVar3->_M_string_length;
  absl::lts_20250127::log_internal::LogMessage::operator<<(&local_68,v_00);
  absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
            ((LogMessageDebugFatal *)&local_68);
  return (Message *)0x0;
}

Assistant:

const Message* GeneratedMessageFactory::TryGetPrototype(
    const Descriptor* type) {
  absl::optional<const Message*> result;
  {
    absl::ReaderMutexLock lock(&mutex_);
    result = FindInTypeMap(type);
    if (result.has_value() && *result != nullptr) {
      return *result;
    }
  }

  // If the type is not in the generated pool, then we can't possibly handle
  // it.
  if (type->file()->pool() != DescriptorPool::generated_pool()) return nullptr;

  // Apparently the file hasn't been registered yet.  Let's do that now.
  const internal::DescriptorTable* registration_data =
      FindInFileMap(type->file()->name());
  if (registration_data == nullptr) {
    ABSL_DLOG(FATAL) << "File appears to be in generated pool but wasn't "
                        "registered: "
                     << type->file()->name();
    return nullptr;
  }

  {
    absl::WriterMutexLock lock(&mutex_);

    // Check if another thread preempted us.
    result = FindInTypeMap(type);
    if (!result.has_value()) {
      // Nope.  OK, register everything.
      internal::RegisterFileLevelMetadata(registration_data);
      // Should be here now.
      result = FindInTypeMap(type);
      ABSL_DCHECK(result.has_value());
    }
  }

  return *result;
}